

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O3

void __thiscall
sf::priv::GlxContext::updateSettingsFromVisualInfo(GlxContext *this,XVisualInfo *visualInfo)

{
  bool bVar1;
  int samples;
  int multiSampling;
  int stencil;
  int depth;
  int sRgb;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  int local_1c;
  
  glXGetConfig(this->m_display,visualInfo,0xc,&local_20);
  glXGetConfig(this->m_display,visualInfo,0xd,&local_24);
  if (sfglx_ext_ARB_multisample == 1) {
    glXGetConfig(this->m_display,visualInfo,100000,&local_28);
    glXGetConfig(this->m_display,visualInfo,0x186a1,&local_2c);
  }
  else {
    local_28 = 0;
    local_2c = 0;
  }
  if ((sfglx_ext_EXT_framebuffer_sRGB == 1) || (sfglx_ext_ARB_framebuffer_sRGB == 1)) {
    glXGetConfig(this->m_display,visualInfo,0x20b2,&local_1c);
    bVar1 = local_1c == 1;
  }
  else {
    bVar1 = false;
  }
  (this->super_GlContext).m_settings.depthBits = local_20;
  (this->super_GlContext).m_settings.stencilBits = local_24;
  if (local_28 != 0) {
    local_28 = local_2c;
  }
  (this->super_GlContext).m_settings.antialiasingLevel = local_28;
  (this->super_GlContext).m_settings.sRgbCapable = bVar1;
  return;
}

Assistant:

void GlxContext::updateSettingsFromVisualInfo(XVisualInfo* visualInfo)
{
    // Update the creation settings from the chosen format
    int depth, stencil, multiSampling, samples, sRgb;
    glXGetConfig(m_display, visualInfo, GLX_DEPTH_SIZE,   &depth);
    glXGetConfig(m_display, visualInfo, GLX_STENCIL_SIZE, &stencil);

    if (sfglx_ext_ARB_multisample == sfglx_LOAD_SUCCEEDED)
    {
        glXGetConfig(m_display, visualInfo, GLX_SAMPLE_BUFFERS_ARB, &multiSampling);
        glXGetConfig(m_display, visualInfo, GLX_SAMPLES_ARB,        &samples);
    }
    else
    {
        multiSampling = 0;
        samples = 0;
    }

    if ((sfglx_ext_EXT_framebuffer_sRGB == sfglx_LOAD_SUCCEEDED) || (sfglx_ext_ARB_framebuffer_sRGB == sfglx_LOAD_SUCCEEDED))
    {
        glXGetConfig(m_display, visualInfo, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB, &sRgb);
    }
    else
    {
        sRgb = 0;
    }

    m_settings.depthBits         = static_cast<unsigned int>(depth);
    m_settings.stencilBits       = static_cast<unsigned int>(stencil);
    m_settings.antialiasingLevel = multiSampling ? samples : 0;
    m_settings.sRgbCapable       = (sRgb == True);
}